

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapParser.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* rc::detail::parseMap
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,string *str)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  string *psVar3;
  bool bVar4;
  locale *plVar5;
  ctype *pcVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  size_type sVar9;
  size_type start;
  ulong uVar10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pair;
  ParseState local_a8;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  string local_70;
  string local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sVar9 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78 = __return_storage_ptr__;
  do {
    local_a8.str = str;
    local_a8.pos = sVar9;
    anon_unknown_0::skipSpace(&local_a8);
    if (local_a8.pos < (local_a8.str)->_M_string_length) {
      bVar4 = anon_unknown_0::parseQuotedString(&local_a8,&local_70);
      psVar3 = local_a8.str;
      if (!bVar4) {
        uVar10 = local_a8.pos;
        if (local_a8.pos < (local_a8.str)->_M_string_length) {
          while (uVar8 = (ulong)(byte)(psVar3->_M_dataplus)._M_p[uVar10],
                __return_storage_ptr__ = local_78, uVar8 != 0x3d) {
            plVar5 = (locale *)std::locale::classic();
            pcVar6 = std::use_facet<std::ctype<char>>(plVar5);
            __return_storage_ptr__ = local_78;
            if (((*(byte *)(*(long *)(pcVar6 + 0x30) + 1 + uVar8 * 2) & 0x20) != 0) ||
               (uVar10 = uVar10 + 1, psVar3->_M_string_length <= uVar10)) break;
          }
        }
        local_a8.pos = uVar10;
        std::__cxx11::string::substr((ulong)&local_98,(ulong)psVar3);
        goto LAB_0016d3db;
      }
    }
    else {
      local_90 = 0;
      local_88[0] = 0;
      local_98 = local_88;
LAB_0016d3db:
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_98);
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
    }
    if (local_70._M_string_length == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
    anon_unknown_0::skipSpace(&local_a8);
    if ((local_a8.pos < (local_a8.str)->_M_string_length) &&
       (((local_a8.str)->_M_dataplus)._M_p[local_a8.pos] == '=')) {
      local_a8.pos = local_a8.pos + 1;
      anon_unknown_0::skipSpace(&local_a8);
      if ((local_a8.str)->_M_string_length <= local_a8.pos) goto LAB_0016d4e2;
      bVar4 = anon_unknown_0::parseQuotedString(&local_a8,&local_50);
      str = local_a8.str;
      sVar9 = local_a8.pos;
      if (!bVar4) {
        if (local_a8.pos < (local_a8.str)->_M_string_length) {
          do {
            bVar2 = (str->_M_dataplus)._M_p[sVar9];
            plVar5 = (locale *)std::locale::classic();
            pcVar6 = std::use_facet<std::ctype<char>>(plVar5);
            if ((*(byte *)(*(long *)(pcVar6 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) != 0) break;
            sVar9 = sVar9 + 1;
          } while (sVar9 < str->_M_string_length);
        }
        __return_storage_ptr__ = local_78;
        std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_98);
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
      }
    }
    else {
LAB_0016d4e2:
      sVar9 = local_a8.pos;
      str = local_a8.str;
      local_90 = 0;
      local_88[0] = 0;
      local_98 = local_88;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_98);
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
    }
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,&local_70);
    std::__cxx11::string::_M_assign((string *)pmVar7);
  } while( true );
}

Assistant:

std::map<std::string, std::string> parseMap(const std::string &str) {
  std::map<std::string, std::string> config;
  ParseState state;
  state.str = &str;
  state.pos = 0;

  std::pair<std::string, std::string> pair;
  while (parsePair(state, pair)) {
    config[pair.first] = pair.second;
  }

  return config;
}